

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabSet.cpp
# Opt level: O0

void __thiscall
amrex::FabSet::FabSet(FabSet *this,BoxArray *grids,DistributionMapping *dmap,int ncomp)

{
  undefined4 in_ECX;
  undefined4 in_stack_ffffffffffffff90;
  undefined8 *puVar1;
  DistributionMapping *in_stack_ffffffffffffffa0;
  BoxArray *in_stack_ffffffffffffffa8;
  FabFactory<amrex::FArrayBox> this_00;
  undefined8 local_48;
  FabFactory<amrex::FArrayBox> *factory;
  
  local_48 = 0;
  factory = (FabFactory<amrex::FArrayBox> *)0x0;
  puVar1 = &local_48;
  MFInfo::MFInfo((MFInfo *)0x10511f7);
  this_00._vptr_FabFactory = (_func_int **)0x0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)&stack0xffffffffffffffb0);
  MultiFab::MultiFab((MultiFab *)this_00._vptr_FabFactory,in_stack_ffffffffffffffa8,
                     in_stack_ffffffffffffffa0,(int)((ulong)puVar1 >> 0x20),(int)puVar1,
                     (MFInfo *)CONCAT44(in_ECX,in_stack_ffffffffffffff90),factory);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x1051246);
  MFInfo::~MFInfo((MFInfo *)0x1051250);
  return;
}

Assistant:

FabSet::FabSet (const BoxArray& grids, const DistributionMapping& dmap, int ncomp)
    :
    m_mf(grids,dmap,ncomp,0,MFInfo(),FArrayBoxFactory())
{}